

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cc
# Opt level: O0

unique_ptr<Source,_std::default_delete<Source>_> Source::build(string *type,Config *config)

{
  bool bVar1;
  pointer pNVar2;
  runtime_error *prVar3;
  long in_RDX;
  __uniq_ptr_data<Source,_std::default_delete<Source>,_true,_true> in_RDI;
  unique_ptr<Nanomsg,_std::default_delete<Nanomsg>_> nanomsg;
  unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  unique_ptr<Nanomsg,_std::default_delete<Nanomsg>_> *this;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar4;
  char *in_stack_ffffffffffffffa8;
  unique_ptr<Nanomsg,_std::default_delete<Nanomsg>_> local_30 [3];
  long local_18;
  
  local_18 = in_RDX;
  bVar1 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  if (bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,
               "You configured goesrecv to use the \"airspy\" source, but goesrecv was not compiled with Airspy support. Make sure to install the Airspy library before compiling goestools, and look for a message saying \'Found libairspy\' when running cmake."
              );
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  if (bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,
               "You configured goesrecv to use the \"hackrf\" source, but goesrecv was not compiled with HackRF support. Make sure to install the HackRF library before compiling goestools, and look for a message saying \'Found libhackrf\' when running cmake."
              );
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  if (bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,
               "You configured goesrecv to use the \"rtlsdr\" source, but goesrecv was not compiled with RTL-SDR support. Make sure to install the RTL-SDR library before compiling goestools, and look for a message saying \'Found librtlsdr\' when running cmake."
              );
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  if (!bVar1) {
    uVar4 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffffa8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar4,in_stack_ffffffffffffffa0));
    std::runtime_error::runtime_error(prVar3,(string *)&stack0xffffffffffffffa8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this = local_30;
  Nanomsg::open((char *)this,(int)local_18);
  pNVar2 = std::unique_ptr<Nanomsg,_std::default_delete<Nanomsg>_>::operator->
                     ((unique_ptr<Nanomsg,_std::default_delete<Nanomsg>_> *)0x1b3492);
  Nanomsg::setSampleRate((Nanomsg *)pNVar2,*(uint32_t *)(local_18 + 0xb0));
  pNVar2 = std::unique_ptr<Nanomsg,_std::default_delete<Nanomsg>_>::operator->
                     ((unique_ptr<Nanomsg,_std::default_delete<Nanomsg>_> *)0x1b34b4);
  std::unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_>::unique_ptr
            ((unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *)pNVar2,
             in_stack_ffffffffffffff58);
  Nanomsg::setSamplePublisher(pNVar2,in_stack_ffffffffffffff58);
  std::unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_>::~unique_ptr
            ((unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *)this);
  std::unique_ptr<Nanomsg,_std::default_delete<Nanomsg>_>::release
            ((unique_ptr<Nanomsg,_std::default_delete<Nanomsg>_> *)0x1b34fc);
  std::unique_ptr<Source,std::default_delete<Source>>::unique_ptr<std::default_delete<Source>,void>
            ((unique_ptr<Source,_std::default_delete<Source>_> *)pNVar2,
             (pointer)in_stack_ffffffffffffff58);
  std::unique_ptr<Nanomsg,_std::default_delete<Nanomsg>_>::~unique_ptr(this);
  return (__uniq_ptr_data<Source,_std::default_delete<Source>,_true,_true>)
         (tuple<Source_*,_std::default_delete<Source>_>)
         in_RDI.super___uniq_ptr_impl<Source,_std::default_delete<Source>_>._M_t.
         super__Tuple_impl<0UL,_Source_*,_std::default_delete<Source>_>.
         super__Head_base<0UL,_Source_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Source> Source::build(const std::string& type, Config& config) {
  if (type == "airspy") {
#ifdef BUILD_AIRSPY
    auto airspy = Airspy::open();

    // Use sample rate if set, otherwise default to lowest possible rate.
    // This is 2.5MSPS for the R2 and 3M for the Mini.
    auto rates = airspy->getSampleRates();
    if (config.airspy.sampleRate != 0) {
      auto rate = config.airspy.sampleRate;
      auto pos = std::find(rates.begin(), rates.end(), rate);
      if (pos == rates.end()) {
        std::stringstream ss;
        ss << "You configured the Airspy source to use an unsupported "
           << "sample rate equal to " << rate << ". "
           << "Supported sample rates are: " << std::endl;
        for (size_t i = 0; i < rates.size(); i++) {
          ss << " - " << rates[i] << std::endl;
        }
        throw std::runtime_error(ss.str());
      }
      airspy->setSampleRate(rate);
    } else {
      std::sort(rates.begin(), rates.end());
      airspy->setSampleRate(rates[0]);
    }
    airspy->setFrequency(config.airspy.frequency);
    airspy->setGain(config.airspy.gain);
    airspy->setBiasTee(config.airspy.bias_tee);
    airspy->setSamplePublisher(std::move(config.airspy.samplePublisher));
    return std::unique_ptr<Source>(airspy.release());
#else
    throw std::runtime_error(
        "You configured goesrecv to use the \"airspy\" source, "
        "but goesrecv was not compiled with Airspy support. "
        "Make sure to install the Airspy library before compiling goestools, "
        "and look for a message saying 'Found libairspy' when running cmake.");
#endif
  }

  if (type == "hackrf") {
#ifdef BUILD_HACKRF
    auto hackrf = HackRF::open();

    // Use sample rate if set, otherwise default to lowest possible rate.
    auto rates = hackrf->getSampleRates();
    if (config.hackrf.sampleRate != 0) {
      auto rate = config.hackrf.sampleRate;
      auto pos = std::find(rates.begin(), rates.end(), rate);
      if (pos == rates.end()) {
        std::stringstream ss;
        ss << "You configured the HackRF source to use an unsupported "
           << "sample rate equal to " << rate << ". "
           << "Supported sample rates are: " << std::endl;
        for (size_t i = 0; i < rates.size(); i++) {
          ss << " - " << rates[i] << std::endl;
        }
        throw std::runtime_error(ss.str());
      }
      hackrf->setSampleRate(rate);
    } else {
      std::sort(rates.begin(), rates.end());
      hackrf->setSampleRate(rates[0]);
    }

    hackrf->setFrequency(config.hackrf.frequency);
    hackrf->setRfAmplifier(config.hackrf.rf_amp_enabled);
    hackrf->setIfGain(config.hackrf.if_gain);
    hackrf->setBbGain(config.hackrf.bb_gain);
    hackrf->setBiasTee(config.hackrf.bias_tee);
    hackrf->setSamplePublisher(std::move(config.airspy.samplePublisher));
    return std::unique_ptr<Source>(hackrf.release());
#else
    throw std::runtime_error(
        "You configured goesrecv to use the \"hackrf\" source, "
        "but goesrecv was not compiled with HackRF support. "
        "Make sure to install the HackRF library before compiling goestools, "
        "and look for a message saying 'Found libhackrf' when running cmake.");
#endif
  }

  if (type == "rtlsdr") {
#ifdef BUILD_RTLSDR
    auto rtlsdr = RTLSDR::open(config.rtlsdr.deviceIndex);

    // Use sample rate if set, otherwise default to 2.4MSPS.
    if (config.rtlsdr.sampleRate != 0) {
      rtlsdr->setSampleRate(config.rtlsdr.sampleRate);
    } else {
      rtlsdr->setSampleRate(2400000);
    }
    rtlsdr->setFrequency(config.rtlsdr.frequency);
    rtlsdr->setTunerGain(config.rtlsdr.gain);
    rtlsdr->setBiasTee(config.rtlsdr.bias_tee);
    rtlsdr->setSamplePublisher(std::move(config.rtlsdr.samplePublisher));
    return std::unique_ptr<Source>(rtlsdr.release());
#else
    throw std::runtime_error(
        "You configured goesrecv to use the \"rtlsdr\" source, "
        "but goesrecv was not compiled with RTL-SDR support. "
        "Make sure to install the RTL-SDR library before compiling goestools, "
        "and look for a message saying 'Found librtlsdr' when running cmake.");
#endif
  }
  if (type == "nanomsg") {
    auto nanomsg = Nanomsg::open(config);
    nanomsg->setSampleRate(config.nanomsg.sampleRate);
    nanomsg->setSamplePublisher(std::move(config.nanomsg.samplePublisher));
    return std::unique_ptr<Source>(nanomsg.release());
  }

  throw std::runtime_error("Invalid source: " + type);
}